

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_ostream_operator
          (t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  bVar2 = has_custom_ostream(this,&tstruct->super_t_type);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)tstruct_local,
                             "std::ostream& operator<<(std::ostream& out, const ");
    iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
    poVar4 = std::operator<<(poVar4,"& obj)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tstruct_local);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_40);
    poVar4 = std::operator<<(poVar4,"obj.printTo(out);");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4,"return out;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_40);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_struct_ostream_operator(std::ostream& out, t_struct* tstruct) {
  if (!has_custom_ostream(tstruct)) {
    // thrift defines this behavior
    out << "std::ostream& operator<<(std::ostream& out, const "
        << tstruct->get_name()
        << "& obj)" << endl;
    scope_up(out);
    out << indent() << "obj.printTo(out);" << endl
        << indent() << "return out;" << endl;
    scope_down(out);
    out << endl;
  }
}